

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowFocus(char *name)

{
  ImGuiWindow *window_00;
  ImGuiWindow *window;
  char *name_local;
  
  if (name == (char *)0x0) {
    FocusWindow((ImGuiWindow *)0x0);
  }
  else {
    window_00 = FindWindowByName(name);
    if (window_00 != (ImGuiWindow *)0x0) {
      FocusWindow(window_00);
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowFocus(const char* name)
{
    if (name)
    {
        if (ImGuiWindow* window = FindWindowByName(name))
            FocusWindow(window);
    }
    else
    {
        FocusWindow(NULL);
    }
}